

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiTests.cpp
# Opt level: O2

void vkt::wsi::anon_unknown_1::createTypeSpecificTests(TestCaseGroup *testGroup,Type wsiType)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"surface",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"VkSurface Tests",&local_52);
  addTestGroup<vk::wsi::Type>(testGroup,&local_30,&local_50,createSurfaceTests,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"swapchain",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"VkSwapchain Tests",&local_52);
  addTestGroup<vk::wsi::Type>(testGroup,&local_30,&local_50,createSwapchainTests,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"display_timing",&local_51)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Display Timing Tests",&local_52);
  addTestGroup<vk::wsi::Type>(testGroup,&local_30,&local_50,createDisplayTimingTests,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void createTypeSpecificTests (tcu::TestCaseGroup* testGroup, vk::wsi::Type wsiType)
{
	addTestGroup(testGroup, "surface",				"VkSurface Tests",				createSurfaceTests,				wsiType);
	addTestGroup(testGroup, "swapchain",			"VkSwapchain Tests",			createSwapchainTests,			wsiType);
	addTestGroup(testGroup, "display_timing",		"Display Timing Tests",			createDisplayTimingTests,		wsiType);
}